

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_torrent.cpp
# Opt level: O2

void __thiscall
libtorrent::create_torrent::set_hash2
          (create_torrent *this,file_index_t file,diff_type piece,sha256_hash *h)

{
  uint *puVar1;
  pointer pcVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  pointer pdVar6;
  pointer pcVar7;
  error_code_enum local_34;
  
  if ((this->field_0x258 & 0x20) == 0) {
    pcVar2 = (this->m_files).
             super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
             .
             super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar7 = (this->m_file_piece_hash).
             super_vector<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>,_std::allocator<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>_>
             .
             super__Vector_base<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>,_std::allocator<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pcVar7 == (this->m_file_piece_hash).
                  super_vector<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>,_std::allocator<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>_>
                  .
                  super__Vector_base<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>,_std::allocator<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      ::std::
      vector<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>,_std::allocator<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>_>
      ::resize(&(this->m_file_piece_hash).
                super_vector<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>,_std::allocator<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>_>
               ,((long)(this->m_files).
                       super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                       .
                       super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar2) / 0x58);
      pcVar7 = (this->m_file_piece_hash).
               super_vector<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>,_std::allocator<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>_>
               .
               super__Vector_base<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>,_std::allocator<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    pdVar6 = pcVar7[file.m_val].
             super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
             super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pdVar6 == pcVar7[file.m_val].
                  super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                  .
                  super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      ::std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::
      resize(&pcVar7[file.m_val].
              super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
             ,(long)(int)((*(int64_t *)((long)(pcVar2 + file.m_val) + 0x20) +
                           (long)this->m_piece_length + -1) / (long)this->m_piece_length));
      pdVar6 = pcVar7[file.m_val].
               super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
               .
               super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    uVar3 = *(undefined8 *)(h->m_number)._M_elems;
    uVar4 = *(undefined8 *)((h->m_number)._M_elems + 2);
    uVar5 = *(undefined8 *)((h->m_number)._M_elems + 6);
    puVar1 = pdVar6[piece.m_val].m_number._M_elems + 4;
    *(undefined8 *)puVar1 = *(undefined8 *)((h->m_number)._M_elems + 4);
    *(undefined8 *)(puVar1 + 2) = uVar5;
    *(undefined8 *)pdVar6[piece.m_val].m_number._M_elems = uVar3;
    *(undefined8 *)(pdVar6[piece.m_val].m_number._M_elems + 2) = uVar4;
    return;
  }
  aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>(&local_34);
}

Assistant:

void create_torrent::set_hash2(file_index_t const file
		, piece_index_t::diff_type const piece
		, sha256_hash const& h)
	{
		TORRENT_ASSERT_PRECOND(file >= file_index_t(0));
		TORRENT_ASSERT_PRECOND(file < end_file());
		TORRENT_ASSERT_PRECOND(piece >= piece_index_t::diff_type(0));
		TORRENT_ASSERT_PRECOND(!h.is_all_zeros());

		auto const& f = m_files[file];

		TORRENT_ASSERT_PRECOND(!(f.flags & file_storage::flag_pad_file));
		TORRENT_ASSERT_PRECOND(piece < piece_index_t::diff_type(file_num_pieces(f.size, m_piece_length)));
		TORRENT_ASSERT_PRECOND(file_num_pieces(f.size, m_piece_length) > 0);

		if (m_v1_only)
			aux::throw_ex<system_error>(errors::invalid_hash_entry);

		if (m_file_piece_hash.empty())
			m_file_piece_hash.resize(m_files.size());

		auto& fh = m_file_piece_hash[file];
		if (fh.empty())
			fh.resize(std::size_t(file_num_pieces(f.size, m_piece_length)));
		fh[piece] = h;
	}